

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O2

void __thiscall
gui::TextBox::TextBox(TextBox *this,shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  _Rb_tree_header *p_Var1;
  
  Widget::Widget(&this->super_Widget,name);
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextBox_002701a8;
  (this->onMousePress).enabled_ = true;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onMouseRelease).enabled_ = true;
  p_Var1 = &(this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onClick).enabled_ = true;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onTextChange).enabled_ = true;
  p_Var1 = &(this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onEnterPressed).enabled_ = true;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>,
             &style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>);
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  this->widthCharacters_ = 0;
  this->maxCharacters_ = 0;
  this->readOnly_ = false;
  sf::String::String(&this->boxString_);
  sf::String::String(&this->defaultString_);
  sf::String::String(&this->visibleString_);
  this->horizontalScroll_ = 0;
  (this->caretDrawPosition_).x = 0.0;
  (this->caretDrawPosition_).y = 0.0;
  updateCaretPosition(this,0);
  return;
}

Assistant:

TextBox::TextBox(std::shared_ptr<TextBoxStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    widthCharacters_(0),
    maxCharacters_(0),
    readOnly_(false),
    horizontalScroll_(0) {

    updateCaretPosition(0);
}